

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O3

void Vec_WrdPushOrder(Vec_Wrd_t *p,word Entry)

{
  uint uVar1;
  bool bVar2;
  word *pwVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = p->nSize;
  uVar5 = (ulong)uVar1;
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (word *)0x0) {
        pwVar3 = (word *)malloc(0x80);
      }
      else {
        pwVar3 = (word *)realloc(p->pArray,0x80);
      }
      p->pArray = pwVar3;
      iVar4 = 0x10;
      if (pwVar3 == (word *)0x0) {
LAB_002c4625:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
    }
    else {
      if (p->pArray == (word *)0x0) {
        pwVar3 = (word *)malloc(uVar5 << 4);
      }
      else {
        pwVar3 = (word *)realloc(p->pArray,uVar5 << 4);
      }
      p->pArray = pwVar3;
      if (pwVar3 == (word *)0x0) goto LAB_002c4625;
      iVar4 = uVar1 * 2;
    }
    p->nCap = iVar4;
    uVar5 = (ulong)(uint)p->nSize;
  }
  p->nSize = (int)uVar5 + 1;
  pwVar3 = p->pArray;
  if (0 < (int)uVar5) {
    do {
      if (pwVar3[uVar5 - 1] <= Entry) goto LAB_002c4618;
      pwVar3[uVar5] = pwVar3[uVar5 - 1];
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    uVar5 = 0;
  }
LAB_002c4618:
  pwVar3[(int)uVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPushOrder( Vec_Wrd_t * p, word Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}